

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O3

void __thiscall
slang::parsing::ParserBase::Window::insertHead
          (Window *this,span<const_slang::parsing::Token,_18446744073709551615UL> tokens)

{
  ulong uVar1;
  __extent_storage<18446744073709551615UL> _Var2;
  long lVar3;
  
  _Var2 = tokens._M_extent._M_extent_value;
  uVar1 = this->currentOffset;
  if (uVar1 < _Var2._M_extent_value) {
    lVar3 = this->count - uVar1;
    memmove(this->buffer + _Var2._M_extent_value,this->buffer + uVar1,lVar3 * 0x10);
    memcpy(this->buffer,tokens._M_ptr,_Var2._M_extent_value * 0x10);
    this->currentOffset = 0;
    this->count = lVar3 + _Var2._M_extent_value;
    return;
  }
  this->currentOffset = uVar1 - _Var2._M_extent_value;
  memcpy(this->buffer + (uVar1 - _Var2._M_extent_value),tokens._M_ptr,_Var2._M_extent_value << 4);
  return;
}

Assistant:

void ParserBase::Window::insertHead(std::span<const Token> tokens) {
    if (currentOffset >= tokens.size()) {
        currentOffset -= tokens.size();
        memcpy(buffer + currentOffset, tokens.data(), tokens.size() * sizeof(Token));
        return;
    }

    size_t existing = count - currentOffset;
    SLANG_ASSERT(tokens.size() + existing < capacity);

    memmove(buffer + tokens.size(), buffer + currentOffset, existing * sizeof(Token));
    memcpy(buffer, tokens.data(), tokens.size() * sizeof(Token));

    currentOffset = 0;
    count = tokens.size() + existing;
}